

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O3

string * __thiscall
cmCPackIFWPackage::DependenceStruct::NameWithCompare_abi_cxx11_
          (string *__return_storage_ptr__,DependenceStruct *this)

{
  pointer pcVar1;
  long lVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->Name)._M_string_length);
  lVar2 = std::__cxx11::string::find((char)this,0x2d);
  if (((lVar2 != -1) || ((this->Compare).Type != 0)) ||
     ((this->Compare).Value._M_string_length != 0)) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((this->Compare).Type - 1 < 5) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,(ulong)(this->Compare).Value._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackIFWPackage::DependenceStruct::NameWithCompare() const
{
  std::string result = this->Name;
  if (this->Name.find('-') != std::string::npos) {
    // When a name contains a hyphen, we must use a colon after the name to
    // prevent the hyphen from being parsed by QtIFW as the separator between
    // the name and the version. Note that a colon is only supported with
    // QtIFW 3.1 or later.
    result += ":";
  } else if (this->Compare.Type != cmCPackIFWPackage::CompareNone ||
             !this->Compare.Value.empty()) {
    // No hyphen in the name and we know a version part will follow. Use a
    // hyphen as a separator since this works for all QtIFW versions.
    result += "-";
  }

  if (this->Compare.Type == cmCPackIFWPackage::CompareLessOrEqual) {
    result += "<=";
  } else if (this->Compare.Type == cmCPackIFWPackage::CompareGreaterOrEqual) {
    result += ">=";
  } else if (this->Compare.Type == cmCPackIFWPackage::CompareLess) {
    result += "<";
  } else if (this->Compare.Type == cmCPackIFWPackage::CompareEqual) {
    result += "=";
  } else if (this->Compare.Type == cmCPackIFWPackage::CompareGreater) {
    result += ">";
  }

  result += this->Compare.Value;

  return result;
}